

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * QString::sliced_helper
                    (QString *__return_storage_ptr__,QString *str,qsizetype pos,qsizetype n)

{
  char16_t *__old_val;
  char16_t *pcVar1;
  undefined1 *puVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (n == 0) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    pcVar1 = L"";
    pDVar3 = (Data *)0x0;
    puVar2 = (undefined1 *)0x0;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::sliced(&local_48,&str->d,pos,n);
    puVar2 = (undefined1 *)local_48.size;
    pcVar1 = local_48.ptr;
    pDVar3 = local_48.d;
    local_48.ptr[n] = L'\0';
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr = pcVar1;
  (__return_storage_ptr__->d).size = (qsizetype)puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::sliced_helper(QString &str, qsizetype pos, qsizetype n)
{
    if (n == 0)
        return QString(DataPointer::fromRawData(&_empty, 0));
    DataPointer d = std::move(str.d).sliced(pos, n);
    d.data()[n] = 0;
    return QString(std::move(d));
}